

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_Shutdown(void)

{
  int local_c;
  ImGuiMouseCursor cursor_n;
  
  if (g_InstalledCallbacks) {
    glfwSetMouseButtonCallback(g_Window,g_PrevUserCallbackMousebutton);
    glfwSetScrollCallback(g_Window,g_PrevUserCallbackScroll);
    glfwSetKeyCallback(g_Window,g_PrevUserCallbackKey);
    glfwSetCharCallback(g_Window,g_PrevUserCallbackChar);
    g_InstalledCallbacks = false;
  }
  for (local_c = 0; local_c < 9; local_c = local_c + 1) {
    glfwDestroyCursor(g_MouseCursors[local_c]);
    g_MouseCursors[local_c] = (GLFWcursor *)0x0;
  }
  g_ClientApi = GlfwClientApi_Unknown;
  return;
}

Assistant:

void ImGui_ImplGlfw_Shutdown()
{
    if (g_InstalledCallbacks)
    {
        glfwSetMouseButtonCallback(g_Window, g_PrevUserCallbackMousebutton);
        glfwSetScrollCallback(g_Window, g_PrevUserCallbackScroll);
        glfwSetKeyCallback(g_Window, g_PrevUserCallbackKey);
        glfwSetCharCallback(g_Window, g_PrevUserCallbackChar);
        g_InstalledCallbacks = false;
    }

    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
    {
        glfwDestroyCursor(g_MouseCursors[cursor_n]);
        g_MouseCursors[cursor_n] = NULL;
    }
    g_ClientApi = GlfwClientApi_Unknown;
}